

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.cpp
# Opt level: O2

void CBinds::ConUnbind(IResult *pResult,void *pUserData)

{
  long *plVar1;
  int iVar2;
  int KeyID;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  int Modifier;
  char aBuf [256];
  int local_12c;
  char local_128 [264];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (*pResult->_vptr_IResult[4])(pResult,0);
  KeyID = DecodeBindString((CBinds *)pResult,(char *)CONCAT44(extraout_var,iVar2),&local_12c);
  if (KeyID == 0) {
    str_format(local_128,0x100,"key %s not found",(char *)CONCAT44(extraout_var,iVar2));
    plVar1 = *(long **)(*(long *)((long)pUserData + 8) + 0x870);
    (**(code **)(*plVar1 + 200))(plVar1,0,"binds",local_128,0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    Bind((CBinds *)pUserData,KeyID,local_12c,"");
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CBinds::ConUnbind(IConsole::IResult *pResult, void *pUserData)
{
	CBinds *pBinds = (CBinds *)pUserData;
	const char *pKeyName = pResult->GetString(0);
	int Modifier;
	int KeyID = pBinds->DecodeBindString(pKeyName, &Modifier);

	if(!KeyID)
	{
		char aBuf[256];
		str_format(aBuf, sizeof(aBuf), "key %s not found", pKeyName);
		pBinds->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "binds", aBuf);
		return;
	}

	pBinds->Bind(KeyID, Modifier, "");
}